

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O2

int file_write_ul(png_t *png,uint in)

{
  long lVar1;
  size_t in_RCX;
  long in_FS_OFFSET;
  uchar buf [4];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  buf = (uchar  [4])(in >> 0x18 | (in & 0xff0000) >> 8 | (in & 0xff00) << 8 | in << 0x18);
  file_write(png,buf,4,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static int file_write_ul(png_t* png, unsigned in)
{
	unsigned char buf[4];

	buf[0] = (in>>24u) & 0xffu;
	buf[1] = (in>>16u) & 0xffu;
	buf[2] = (in>>8u) & 0xffu;
	buf[3] = (in) & 0xffu;

	if(file_write(png, buf, 1, 4) != 4)
		return PNG_FILE_ERROR;

	return PNG_NO_ERROR;
}